

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

void udp_sender(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined8 uStack_28;
  int r;
  uv_buf_t buf;
  sockaddr_in server_addr;
  
  iVar1 = uv_udp_init(loop,&udp);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x137,"!r");
    abort();
  }
  auVar2 = uv_buf_init("PING",4);
  buf.base = auVar2._8_8_;
  uStack_28 = auVar2._0_8_;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x13a,"0 == uv_ip4_addr(\"127.0.0.1\", server_port, &server_addr)");
    abort();
  }
  iVar1 = uv_udp_send(&send_req,&udp,&stack0xffffffffffffffd8,1,&buf.len,udp_send);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,0x142,"!r");
    abort();
  }
  return;
}

Assistant:

static void udp_sender(void) {
  struct sockaddr_in server_addr;
  uv_buf_t buf;
  int r;

  r = uv_udp_init(loop, &udp);
  ASSERT(!r);

  buf = uv_buf_init("PING", 4);
  ASSERT(0 == uv_ip4_addr("127.0.0.1", server_port, &server_addr));

  r = uv_udp_send(&send_req,
                  &udp,
                  &buf,
                  1,
                  (const struct sockaddr*) &server_addr,
                  udp_send);
  ASSERT(!r);
}